

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

void __thiscall
Tokenizer::registerReplacement(Tokenizer *this,Identifier *identifier,string *newValue)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  undefined1 local_168 [8];
  Replacement replacement;
  string local_110;
  Identifier local_f0;
  undefined1 local_d0 [8];
  Token tok;
  string local_40 [8];
  string lowerCase;
  string *newValue_local;
  Identifier *identifier_local;
  Tokenizer *this_local;
  
  lowerCase.field_2._8_8_ = newValue;
  std::__cxx11::string::string(local_40,(string *)newValue);
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  __result._M_current = (char *)std::__cxx11::string::begin();
  tok.originalText.field_2._8_8_ =
       std::
       transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                 (__first,__last,__result,tolower);
  Token::Token((Token *)local_d0);
  tok.column._0_4_ = 1;
  std::__cxx11::string::string((string *)&local_110,local_40);
  Identifier::Identifier(&local_f0,&local_110);
  std::__cxx11::string::string
            ((string *)
             &replacement.value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(string *)lowerCase.field_2._8_8_);
  Token::setValue<Identifier>
            ((Token *)local_d0,&local_f0,
             (string *)
             &replacement.value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &replacement.value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Identifier::~Identifier(&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  Replacement::Replacement((Replacement *)local_168);
  Identifier::operator=((Identifier *)local_168,identifier);
  std::vector<Token,_std::allocator<Token>_>::push_back
            ((vector<Token,_std::allocator<Token>_> *)
             ((long)&replacement.identifier._name.field_2 + 8),(value_type *)local_d0);
  std::vector<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>::push_back
            (&this->replacements,(value_type *)local_168);
  Replacement::~Replacement((Replacement *)local_168);
  Token::~Token((Token *)local_d0);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void Tokenizer::registerReplacement(const Identifier& identifier, const std::string& newValue)
{
	// Ensure the new identifier is lower case as it would be as a normally parsed string
	std::string lowerCase = newValue;
	std::transform(lowerCase.begin(), lowerCase.end(), lowerCase.begin(), ::tolower);

	Token tok;
	tok.type = TokenType::Identifier;
	tok.setValue(Identifier(lowerCase), newValue);

	Replacement replacement;
	replacement.identifier = identifier;
	replacement.value.push_back(tok);

	replacements.push_back(replacement);
}